

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.cpp
# Opt level: O0

void __thiscall CVmFormatter::buffer_char(CVmFormatter *this,wchar_t c)

{
  wchar_t *pwVar1;
  size_t *in_RDI;
  size_t exp_len;
  wchar_t *exp;
  wchar_t in_stack_0000e82c;
  CVmFormatter *in_stack_0000e830;
  long in_stack_ffffffffffffffe0;
  CCharmapToLocal *in_stack_ffffffffffffffe8;
  
  pwVar1 = CCharmapToLocal::get_expansion
                     (in_stack_ffffffffffffffe8,(wchar_t)((ulong)in_stack_ffffffffffffffe0 >> 0x20),
                      in_RDI);
  if (pwVar1 == (wchar_t *)0x0) {
    buffer_expchar(in_stack_0000e830,in_stack_0000e82c);
  }
  else {
    for (; in_stack_ffffffffffffffe0 != 0;
        in_stack_ffffffffffffffe0 = in_stack_ffffffffffffffe0 + -1) {
      buffer_expchar(in_stack_0000e830,in_stack_0000e82c);
    }
  }
  return;
}

Assistant:

void CVmFormatter::buffer_char(VMG_ wchar_t c)
{
    const wchar_t *exp;
    size_t exp_len;

    /* check for a display expansion */
    exp = (cmap_ != 0 ? cmap_ : G_cmap_to_ui)->get_expansion(c, &exp_len);
    if (exp != 0)
    {
        /* write each character of the expansion */
        for ( ; exp_len != 0 ; ++exp, --exp_len)
            buffer_expchar(vmg_ *exp);
    }
    else
    {
        /* there's no expansion - buffer the character as-is */
        buffer_expchar(vmg_ c);
    }
}